

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RuntimeObjectSystem.cpp
# Opt level: O2

void __thiscall RuntimeObjectSystem::AddPathToSourceSearch(RuntimeObjectSystem *this,char *path)

{
  mapped_type *pmVar1;
  Path local_40;
  
  FileSystemUtils::Path::Path(&local_40,path);
  pmVar1 = std::
           map<FileSystemUtils::Path,_FileSystemUtils::Path,_std::less<FileSystemUtils::Path>,_std::allocator<std::pair<const_FileSystemUtils::Path,_FileSystemUtils::Path>_>_>
           ::operator[](&this->m_FoundSourceDirectoryMappings,&local_40);
  std::__cxx11::string::assign((char *)&pmVar1->m_string);
  FileSystemUtils::Path::~Path(&local_40);
  return;
}

Assistant:

void RuntimeObjectSystem::AddPathToSourceSearch( const char* path )
{
    m_FoundSourceDirectoryMappings[ path ] = path;
}